

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O3

bool __thiscall
S2MinDistanceEdgeTarget::VisitContainingShapes
          (S2MinDistanceEdgeTarget *this,S2ShapeIndex *index,ShapeVisitor *visitor)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  undefined1 local_20 [24];
  double local_8;
  
  local_8 = (this->a_).c_[2] + (this->b_).c_[2];
  local_20._0_8_ = &PTR__S2DistanceTarget_002bc9b0;
  dVar3 = (this->b_).c_[0] + (this->a_).c_[0];
  dVar4 = (this->b_).c_[1] + (this->a_).c_[1];
  dVar1 = SQRT(dVar4 * dVar4 + dVar3 * dVar3 + local_8 * local_8);
  dVar1 = (double)(~-(ulong)(dVar1 != 0.0) & (ulong)dVar1 |
                  (ulong)(1.0 / dVar1) & -(ulong)(dVar1 != 0.0));
  local_8 = dVar1 * local_8;
  local_20._16_4_ = SUB84(dVar1 * dVar4,0);
  local_20._8_8_ = dVar1 * dVar3;
  local_20._20_4_ = (int)((ulong)(dVar1 * dVar4) >> 0x20);
  bVar2 = S2MinDistancePointTarget::VisitContainingShapes
                    ((S2MinDistancePointTarget *)local_20,index,visitor);
  return bVar2;
}

Assistant:

bool S2MinDistanceEdgeTarget::VisitContainingShapes(
    const S2ShapeIndex& index, const ShapeVisitor& visitor) {
  // We test the center of the edge in order to ensure that edge targets AB
  // and BA yield identical results (which is not guaranteed by the API but
  // users might expect).  Other options would be to test both endpoints, or
  // return different results for AB and BA in some cases.
  S2MinDistancePointTarget target((a_ + b_).Normalize());
  return target.VisitContainingShapes(index, visitor);
}